

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# post.cpp
# Opt level: O2

void Post::post_chunked_extension_invoker(void)

{
  undefined8 uVar1;
  basic_wrap_stringstream<char> local_218;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  post_chunked_extension local_29 [8];
  post_chunked_extension t;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/post.cpp";
  local_78 = "";
  memset(&local_218,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_218);
  std::operator<<((ostream *)&local_218,'\"');
  std::operator<<((ostream *)&local_218,"post_chunked_extension");
  std::operator<<((ostream *)&local_218,"\" fixture ctor");
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_218);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_80,0x6d);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_218);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/post.cpp";
  local_68 = "";
  memset(&local_218,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_218);
  std::operator<<((ostream *)&local_218,'\"');
  std::operator<<((ostream *)&local_218,"post_chunked_extension");
  std::operator<<((ostream *)&local_218,"\" fixture setup");
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_218);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_70,0x6d);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_218);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/post.cpp";
  local_58 = "";
  memset(&local_218,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_218);
  std::operator<<((ostream *)&local_218,'\"');
  std::operator<<((ostream *)&local_218,"post_chunked_extension");
  std::operator<<((ostream *)&local_218,"\" test entry");
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_218);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_60,0x6d);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_218);
  post_chunked_extension::test_method(local_29);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/post.cpp";
  local_48 = "";
  memset(&local_218,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_218);
  std::operator<<((ostream *)&local_218,'\"');
  std::operator<<((ostream *)&local_218,"post_chunked_extension");
  std::operator<<((ostream *)&local_218,"\" fixture teardown");
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_218);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_50,0x6d);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_218);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/post.cpp";
  local_38 = "";
  memset(&local_218,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_218);
  std::operator<<((ostream *)&local_218,'\"');
  std::operator<<((ostream *)&local_218,"post_chunked_extension");
  std::operator<<((ostream *)&local_218,"\" fixture dtor");
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_218);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_40,0x6d);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_218);
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(post_chunked_extension, PostFixture)
{
    const char text[] = "POST /uri.cgi HTTP/1.1\r\n"
                        "From: user@example.com\r\n"
                        "User-Agent: Mozilla/5.0 (Windows NT 6.1; WOW64; rv:18.0) Gecko/20100101 Firefox/18.0\r\n"
                        "Accept: text/html,application/xhtml+xml,application/xml;q=0.9,*/*;q=0.8\r\n"
                        "Accept-Language: en-US,en;q=0.5\r\n"
                        "Accept-Encoding: gzip, deflate\r\n"
                        "Content-Type: text/plain\r\n"
                        "Transfer-Encoding: chunked\r\n"
                        "Host: 127.0.0.1\r\n"
                        "\r\n"
                        "23; name=value\r\n"
                        "This is the data in the first chunk\r\n"
                        "1B; secondname=secondvalue\r\n"
                        "and this is the second one\0\r\n"
                        "0\r\n"
                        "Trailer: value\r\n"
                        "\r\n";

    Request result = parse(text, sizeof(text));
    Request should = RequestDsl()
            .method("POST")
            .uri("/uri.cgi")
            .version(1, 1)
            .header("From", "user@example.com")
            .header("User-Agent", "Mozilla/5.0 (Windows NT 6.1; WOW64; rv:18.0) Gecko/20100101 Firefox/18.0")
            .header("Accept", "text/html,application/xhtml+xml,application/xml;q=0.9,*/*;q=0.8")
            .header("Accept-Language", "en-US,en;q=0.5")
            .header("Accept-Encoding", "gzip, deflate")
            .header("Content-Type", "text/plain")
            .header("Transfer-Encoding", "chunked")
            .header("Host", "127.0.0.1")
            .content("This is the data in the first chunk"
                     "and this is the second one\0")
            .keepAlive(true);

    BOOST_CHECK_EQUAL(result.inspect(), should.inspect());
}